

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall Analyser::unreadToken(Analyser *this)

{
  ulong uVar1;
  pointer pTVar2;
  
  uVar1 = this->_offset;
  if (uVar1 != 0) {
    pTVar2 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar1 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5)) {
      this->_currentLine = (int32_t)pTVar2[uVar1 - 1]._lineNumber;
    }
    this->_offset = uVar1 - 1;
  }
  return;
}

Assistant:

void Analyser::unreadToken() {
	if (_offset == 0) {
		return;
	}
	if (_offset >= _tokens.size()) {
		_offset--;
		return;
	}
	_currentLine = _tokens[_offset - 1].GetLine();
	_offset--;
}